

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdump::OnImportTable
          (BinaryReaderObjdump *this,Index import_index,string_view module_name,
          string_view field_name,Index table_index,Type elem_type,Limits *elem_limits)

{
  undefined8 uVar1;
  size_type sVar2;
  const_pointer pvVar3;
  size_type sVar4;
  const_pointer pvVar5;
  string local_60;
  Index local_3c;
  BinaryReaderObjdump *pBStack_38;
  Index import_index_local;
  BinaryReaderObjdump *this_local;
  string_view field_name_local;
  string_view module_name_local;
  
  module_name_local._M_len = (size_t)module_name._M_str;
  field_name_local._M_str = (char *)module_name._M_len;
  field_name_local._M_len = (size_t)field_name._M_str;
  this_local = (BinaryReaderObjdump *)field_name._M_len;
  local_3c = import_index;
  pBStack_38 = this;
  Type::GetName_abi_cxx11_(&local_60,&elem_type);
  uVar1 = std::__cxx11::string::c_str();
  PrintDetails(this," - table[%u] type=%s initial=%ld",(ulong)table_index,uVar1,elem_limits->initial
              );
  std::__cxx11::string::~string((string *)&local_60);
  if ((elem_limits->has_max & 1U) != 0) {
    PrintDetails(this," max=%ld",elem_limits->max);
  }
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::length
                    ((basic_string_view<char,_std::char_traits<char>_> *)&field_name_local._M_str);
  pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)&field_name_local._M_str);
  sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::length
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  PrintDetails(this," <- %.*s.%.*s\n",sVar2 & 0xffffffff,pvVar3,sVar4 & 0xffffffff,pvVar5);
  Result::Result((Result *)((long)&module_name_local._M_str + 4),Ok);
  return (Result)module_name_local._M_str._4_4_;
}

Assistant:

Result BinaryReaderObjdump::OnImportTable(Index import_index,
                                          std::string_view module_name,
                                          std::string_view field_name,
                                          Index table_index,
                                          Type elem_type,
                                          const Limits* elem_limits) {
  PrintDetails(" - table[%" PRIindex "] type=%s initial=%" PRId64, table_index,
               elem_type.GetName().c_str(), elem_limits->initial);
  if (elem_limits->has_max) {
    PrintDetails(" max=%" PRId64, elem_limits->max);
  }
  PrintDetails(" <- " PRIstringview "." PRIstringview "\n",
               WABT_PRINTF_STRING_VIEW_ARG(module_name),
               WABT_PRINTF_STRING_VIEW_ARG(field_name));
  return Result::Ok;
}